

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affinity.cpp
# Opt level: O0

uint cpuid_from_mask(uint64_t mask,uint *thread_index)

{
  uint i;
  uint count_found;
  uint *thread_index_local;
  uint64_t mask_local;
  uint local_4;
  
  if (cpuid_from_mask::init) {
    local_4 = cpuid_from_mask::lookup[*thread_index];
  }
  else {
    count_found = 0;
    mask_local = mask;
    for (i = 0; i < 0x40; i = i + 1) {
      if ((mask_local & 1) != 0) {
        cpuid_from_mask::lookup[count_found] = i;
        count_found = count_found + 1;
      }
      mask_local = mask_local >> 1;
    }
    cpuid_from_mask::init = true;
    local_4 = cpuid_from_mask::lookup[*thread_index];
  }
  return local_4;
}

Assistant:

unsigned
cpuid_from_mask(uint64_t mask, const unsigned &thread_index)
{
    static unsigned lookup[64];
    static bool init = false;
    if (init)
        return lookup[thread_index];
    unsigned count_found = 0;
    for (unsigned i=0; i<64; i++)
    {
        if (1ULL & mask)
        {
            lookup[count_found] = i;
            count_found++;
        }
        mask >>= 1;
    }
    init = true;
    return lookup[thread_index];
}